

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O2

size_t google::protobuf::internal::(anonymous_namespace)::
       MapValueByteSizeLong<google::protobuf::internal::MapDynamicFieldMessageValueInfo<google::protobuf::MapValueRef_const>>
                 (Type type,
                 MapDynamicFieldMessageValueInfo<const_google::protobuf::MapValueRef> info)

{
  Nullable<const_char_*> failure_msg;
  Message *value;
  size_t sVar1;
  Type local_1c;
  LogMessageFatal local_18;
  
  local_18.super_LogMessage.errno_saver_.saved_errno_ = 10;
  local_1c = type;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::internal::FieldDescriptorLite::Type,google::protobuf::internal::FieldDescriptorLite::Type>
                          (&local_1c,(Type *)&local_18,"type != FieldDescriptor::TYPE_GROUP");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    value = MapValueConstRef::GetMessageValue(&(info.value)->super_MapValueConstRef);
    sVar1 = WireFormatLite::MessageSize<google::protobuf::Message>(value);
    return sVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields_test.cc"
             ,0xea,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
}

Assistant:

inline size_t MapValueByteSizeLong(FieldDescriptor::Type type, InfoT info) {
  // There is a bug in GCC 9.5 where if-constexpr arguments are not understood
  // if passed into a helper function. A reproduction of the bug can be found
  // at: https://godbolt.org/z/65qW3vGhP
  // This is fixed in GCC 10.1+.
  (void)type;  // Suppress -Wunused-but-set-parameter

  if constexpr (info.cpp_type == FieldDescriptor::CPPTYPE_STRING) {
    return WireFormatLite::StringSize(info.Get());
  } else if constexpr (info.cpp_type == FieldDescriptor::CPPTYPE_MESSAGE) {
    ABSL_CHECK_NE(type, FieldDescriptor::TYPE_GROUP);
    return WireFormatLite::MessageSize(info.Get());
  } else {
    return MapPrimitiveFieldByteSize<info.cpp_type>(type, info.Get());
  }
}